

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::read_headers(Stream *strm,Headers *headers)

{
  char *beg;
  undefined1 uVar1;
  int iVar2;
  int extraout_var;
  ulong uVar3;
  undefined1 **ppuVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  stream_line_reader line_reader;
  char buf [2048];
  char local_881;
  Stream *local_880;
  undefined1 *local_878;
  long local_870;
  ulong local_868;
  undefined1 *local_860;
  ulong local_858;
  undefined1 local_850;
  undefined7 uStack_84f;
  anon_class_8_1_b2c1a266 local_840;
  undefined1 local_838 [2056];
  
  local_878 = local_838;
  local_870 = 0x800;
  local_860 = &local_850;
  local_868 = 0;
  local_858 = 0;
  local_850 = 0;
  lVar5 = 0;
  local_880 = strm;
  local_840.headers = headers;
  do {
    iVar2 = (*local_880->_vptr_Stream[4])(local_880,&local_881,1);
    uVar3 = local_868;
    if (extraout_var < 0) {
      bVar7 = false;
      bVar6 = false;
    }
    else if (CONCAT44(extraout_var,iVar2) == 0) {
      bVar6 = lVar5 != 0;
      bVar7 = false;
    }
    else {
      if (local_868 < local_870 - 1U) {
        local_868 = local_868 + 1;
        local_878[uVar3] = local_881;
        local_878[local_868] = 0;
      }
      else {
        if (local_858 == 0) {
          if (local_878[local_868] != '\0') {
            __assert_fail("fixed_buffer_[fixed_buffer_used_size_] == \'\\0\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                          ,0x92f,"void httplib::detail::stream_line_reader::append(char)");
          }
          std::__cxx11::string::_M_replace((ulong)&local_860,0,(char *)0x0,(ulong)local_878);
        }
        std::__cxx11::string::push_back((char)&local_860);
      }
      bVar7 = local_881 != '\n';
      bVar6 = true;
    }
    lVar5 = lVar5 + -1;
  } while (bVar7);
  if (bVar6) {
    uVar3 = local_858;
    if (local_858 == 0) {
      uVar3 = local_868;
    }
    ppuVar4 = &local_860;
    if (local_858 == 0) {
      ppuVar4 = &local_878;
    }
    lVar5 = 3;
    if (1 < uVar3) {
      beg = *ppuVar4;
      if ((((beg[uVar3 - 2] == '\r') && (beg[uVar3 - 1] == '\n')) && (lVar5 = 2, uVar3 != 2)) &&
         (lVar5 = 1, uVar3 < 0x2001)) {
        lVar5 = 0;
        parse_header<httplib::detail::read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
                  (beg,beg + (uVar3 - 2),local_840);
      }
    }
    uVar1 = (*(code *)((long)&DAT_00165818 + (long)(int)(&DAT_00165818)[lVar5]))();
    return (bool)uVar1;
  }
  if (local_860 != &local_850) {
    operator_delete(local_860,CONCAT71(uStack_84f,local_850) + 1);
  }
  return false;
}

Assistant:

inline bool read_headers(Stream &strm, Headers &headers) {
  const auto bufsiz = 2048;
  char buf[bufsiz];
  stream_line_reader line_reader(strm, buf, bufsiz);

  for (;;) {
    if (!line_reader.getline()) { return false; }

    // Check if the line ends with CRLF.
    auto line_terminator_len = 2;
    if (line_reader.end_with_crlf()) {
      // Blank line indicates end of headers.
      if (line_reader.size() == 2) { break; }
#ifdef CPPHTTPLIB_ALLOW_LF_AS_LINE_TERMINATOR
    } else {
      // Blank line indicates end of headers.
      if (line_reader.size() == 1) { break; }
      line_terminator_len = 1;
    }
#else
    } else {
      continue; // Skip invalid line.
    }